

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void whereClauseClear(WhereClause *pWC)

{
  sqlite3 *db;
  WhereOrInfo *pWC_00;
  byte bVar1;
  int iVar2;
  u8 *puVar3;
  
  db = pWC->pParse->db;
  puVar3 = &pWC->a->wtFlags;
  for (iVar2 = pWC->nTerm; 0 < iVar2; iVar2 = iVar2 + -1) {
    bVar1 = *puVar3;
    if ((bVar1 & 1) != 0) {
      sqlite3ExprDelete(db,((WhereTerm *)(puVar3 + -0x1a))->pExpr);
      bVar1 = *puVar3;
    }
    if ((bVar1 & 0x30) != 0) {
      pWC_00 = ((anon_union_8_3_737c4e49_for_u *)(puVar3 + -10))->pOrInfo;
      whereClauseClear(&pWC_00->wc);
      sqlite3DbFree(db,pWC_00);
    }
    puVar3 = puVar3 + 0x38;
  }
  if (pWC->a != pWC->aStatic) {
    sqlite3DbFree(db,pWC->a);
    return;
  }
  return;
}

Assistant:

static void whereClauseClear(WhereClause *pWC){
  int i;
  WhereTerm *a;
  sqlite3 *db = pWC->pParse->db;
  for(i=pWC->nTerm-1, a=pWC->a; i>=0; i--, a++){
    if( a->wtFlags & TERM_DYNAMIC ){
      sqlite3ExprDelete(db, a->pExpr);
    }
    if( a->wtFlags & TERM_ORINFO ){
      whereOrInfoDelete(db, a->u.pOrInfo);
    }else if( a->wtFlags & TERM_ANDINFO ){
      whereAndInfoDelete(db, a->u.pAndInfo);
    }
  }
  if( pWC->a!=pWC->aStatic ){
    sqlite3DbFree(db, pWC->a);
  }
}